

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

float __thiscall
pbrt::MIPMap::EWA<float>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  Point2i PVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  undefined8 in_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined8 in_XMM2_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_78;
  undefined1 extraout_var [60];
  undefined1 auVar23 [64];
  
  iVar7 = (int)(this->pyramid).nStored;
  if (level < iVar7) {
    PVar6 = LevelResolution(this,level);
    auVar4._8_8_ = in_XMM0_Qb;
    auVar4._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
    auVar22 = ZEXT816(0) << 0x40;
    auVar23 = ZEXT1664(auVar22);
    auVar13._8_8_ = 0;
    auVar13._0_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.x;
    auVar13._4_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.y;
    auVar13 = vcvtdq2ps_avx(auVar13);
    local_a8 = dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_a4 = dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_a0 = (float)in_XMM2_Qb;
    fStack_9c = (float)((ulong)in_XMM2_Qb >> 0x20);
    auVar18._0_4_ = auVar13._0_4_ * local_a8;
    auVar18._4_4_ = auVar13._4_4_ * fStack_a4;
    auVar18._8_4_ = auVar13._8_4_ * fStack_a0;
    auVar18._12_4_ = auVar13._12_4_ * fStack_9c;
    auVar1 = vmovshdup_avx(auVar13);
    auVar10 = vmovshdup_avx(auVar4);
    auVar3 = vfmadd213ss_fma(auVar1,auVar10,SUB6416(ZEXT464(0xbf000000),0));
    local_b8 = dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_b4 = dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_b0 = (float)in_XMM1_Qb;
    fStack_ac = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar15._0_4_ = auVar13._0_4_ * local_b8;
    auVar15._4_4_ = auVar13._4_4_ * fStack_b4;
    auVar15._8_4_ = auVar13._8_4_ * fStack_b0;
    auVar15._12_4_ = auVar13._12_4_ * fStack_ac;
    auVar1 = vmovshdup_avx(auVar18);
    auVar19._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar19._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar19._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar19._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar10 = vmovshdup_avx(auVar15);
    auVar19 = vfmadd231ps_fma(auVar19,auVar15,auVar15);
    auVar1 = vfmadd213ss_fma(auVar10,auVar15,ZEXT416((uint)(auVar18._0_4_ * auVar1._0_4_)));
    fVar2 = auVar1._0_4_ * -2.0;
    auVar1._8_4_ = 0x3f800000;
    auVar1._0_8_ = 0x3f8000003f800000;
    auVar1._12_4_ = 0x3f800000;
    auVar10 = vaddps_avx512vl(auVar19,auVar1);
    auVar1 = vmovshdup_avx(auVar10);
    auVar1 = vfmadd213ss_fma(auVar1,auVar10,ZEXT416((uint)(fVar2 * fVar2 * -0.25)));
    fVar16 = 1.0 / auVar1._0_4_;
    fVar2 = fVar2 * fVar16;
    auVar20._0_4_ = auVar10._0_4_ * fVar16;
    auVar20._4_4_ = auVar10._4_4_ * fVar16;
    auVar20._8_4_ = auVar10._8_4_ * fVar16;
    auVar20._12_4_ = auVar10._12_4_ * fVar16;
    auVar1 = vmovshdup_avx(auVar20);
    fVar21 = auVar1._0_4_;
    auVar1 = vfnmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar21 * 4.0)),ZEXT416((uint)fVar2),
                              ZEXT416((uint)fVar2));
    fVar17 = auVar1._0_4_;
    auVar1 = vmaxss_avx(ZEXT416((uint)(fVar21 * fVar17)),auVar22);
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar16 = 1.0 / fVar17 + 1.0 / fVar17;
    auVar19 = vfnmadd213ss_fma(auVar1,ZEXT416((uint)fVar16),auVar3);
    auVar10 = vfmadd213ss_fma(auVar1,ZEXT416((uint)fVar16),auVar3);
    auVar1 = vroundss_avx(auVar19,auVar19,10);
    auVar10 = vroundss_avx(auVar10,auVar10,9);
    if ((int)auVar10._0_4_ < (int)auVar1._0_4_) {
      fVar12 = NAN;
    }
    else {
      auVar4 = vfmadd213ss_fma(auVar13,auVar4,SUB6416(ZEXT464(0xbf000000),0));
      fVar12 = 0.0;
      auVar13 = vmaxss_avx(ZEXT416((uint)(auVar20._0_4_ * fVar17)),auVar22);
      auVar19 = vsqrtss_avx(auVar13,auVar13);
      auVar13 = vfnmadd213ss_fma(auVar19,ZEXT416((uint)fVar16),auVar4);
      auVar13 = vroundss_avx(auVar13,auVar13,10);
      auVar19 = vfmadd213ss_fma(auVar19,ZEXT416((uint)fVar16),auVar4);
      auVar19 = vroundss_avx(auVar19,auVar19,9);
      iVar7 = (int)auVar1._0_4_;
      do {
        if ((int)auVar13._0_4_ <= (int)auVar19._0_4_) {
          local_78 = auVar3._0_4_;
          local_78 = (float)iVar7 - local_78;
          iVar8 = (int)auVar13._0_4_;
          do {
            fVar16 = (float)iVar8 - auVar4._0_4_;
            auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_78 * fVar2 * fVar16)),
                                     ZEXT416((uint)fVar16),ZEXT416((uint)(fVar21 * fVar16)));
            auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)(auVar20._0_4_ * local_78)),
                                     ZEXT416((uint)local_78));
            if (auVar1._0_4_ < 1.0) {
              iVar5 = (int)(auVar1._0_4_ * 128.0);
              if (0x7e < iVar5) {
                iVar5 = 0x7f;
              }
              PVar6.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
              PVar6.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
              fVar16 = *(float *)(MIPFilterLUT + (long)iVar5 * 4);
              auVar14._0_4_ = Texel<float>(this,level,PVar6);
              auVar14._4_60_ = extraout_var;
              auVar1 = vfmadd231ss_fma(ZEXT416(auVar23._0_4_),ZEXT416((uint)fVar16),auVar14._0_16_);
              auVar23 = ZEXT1664(auVar1);
              fVar12 = fVar12 + fVar16;
            }
            iVar8 = iVar8 + 1;
          } while ((int)auVar19._0_4_ + 1 != iVar8);
        }
        bVar9 = iVar7 != (int)auVar10._0_4_;
        iVar7 = iVar7 + 1;
      } while (bVar9);
      fVar12 = auVar23._0_4_ / fVar12;
    }
    return fVar12;
  }
  FVar11 = Texel<float>(this,iVar7 + -1,(Point2i)0x0);
  return FVar11;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});
    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Find ellipse coefficients that bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and evaluate quadratic equation to filter image
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if it is inside the ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * MIPFilterLUTSize, MIPFilterLUTSize - 1);
                Float weight = MIPFilterLUT[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}